

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O2

void * parse_constant(Parser *parser)

{
  uint row;
  Token *name;
  char *file;
  uint uVar1;
  ConstantTerm *pCVar2;
  void *extraout_RAX;
  KindMeta KVar3;
  
  name = parser->token;
  uVar1 = name->kind - ID;
  if ((uVar1 < 0x28) && ((0x8000000101U >> ((ulong)uVar1 & 0x3f) & 1) != 0)) {
    move(parser);
    pCVar2 = new_constant_term(name);
    return pCVar2;
  }
  log_debug(
           "/workspace/llm4binary/github/license_all_cmakelists_25/editso[P]timely-lang/parser.c:697"
           );
  file = parser->lexer->source;
  uVar1 = parser->token->col_pos;
  row = parser->token->row_pos;
  KVar3 = get_kind_meta(name->kind);
  log_code(file,row,uVar1,"Illegal expression: %s",KVar3.name);
  return extraout_RAX;
}

Assistant:

void *parse_constant(Parser *parser) {
    Token *tok = token(parser);
    switch (g_kind(tok)) {
        case NUMBER:
        case FLOAT:
        case ID:
            move(parser);
            return new_constant_term(tok);
        default:
            parse_error(parser, "Illegal expression: %s", get_kind_meta(tok->kind).name);
    }
}